

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionSet.cpp
# Opt level: O1

vector<bool,_std::allocator<bool>_> * __thiscall
OpenMD::SelectionSet::get
          (vector<bool,_std::allocator<bool>_> *__return_storage_ptr__,SelectionSet *this,
          vector<int,_std::allocator<int>_> *bitIndex)

{
  pointer piVar1;
  ulong *puVar2;
  ulong in_RAX;
  pointer pOVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  undefined8 uStack_28;
  
  uStack_28 = in_RAX & 0xffffffffffffff;
  std::vector<bool,_std::allocator<bool>_>::vector
            (__return_storage_ptr__,6,(bool *)((long)&uStack_28 + 7),
             (allocator_type *)((long)&uStack_28 + 6));
  pOVar3 = (this->bitsets_).
           super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar1 = (bitIndex->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
           ._M_start;
  puVar2 = (__return_storage_ptr__->super__Bvector_base<std::allocator<bool>_>)._M_impl.
           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
  uVar4 = *puVar2;
  uVar5 = 0;
  do {
    uVar6 = (ulong)piVar1[uVar5];
    uVar7 = uVar6 + 0x3f;
    if (-1 < (long)uVar6) {
      uVar7 = uVar6;
    }
    uVar8 = uVar4 & ~(1L << (uVar5 & 0x3f));
    uVar4 = uVar4 | 1L << (uVar5 & 0x3f);
    if ((*(ulong *)(((long)uVar7 >> 6) * 8 +
                    *(long *)&(pOVar3->bitset_).super__Bvector_base<std::allocator<bool>_> + -8 +
                   (ulong)((uVar6 & 0x800000000000003f) < 0x8000000000000001) * 8) >> (uVar6 & 0x3f)
        & 1) == 0) {
      uVar4 = uVar8;
    }
    *puVar2 = uVar4;
    uVar5 = uVar5 + 1;
    pOVar3 = pOVar3 + 1;
  } while (uVar5 != 6);
  return __return_storage_ptr__;
}

Assistant:

std::vector<bool> SelectionSet::get(std::vector<int> bitIndex) {
    std::vector<bool> result(N_SELECTIONTYPES);
    for (int i = 0; i < N_SELECTIONTYPES; i++)
      result[i] = bitsets_[i].get(bitIndex[i]);
    return result;
  }